

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Stat_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  int64_t local_70;
  int64_t val_1;
  uint64_t uStack_60;
  uint16_t val;
  uint64_t w;
  char *mark;
  flatcc_builder_ref_t *pref;
  void *pvStack_40;
  flatcc_builder_ref_t ref;
  void *pval;
  flatcc_builder_ref_t *pfStack_30;
  int more;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  pfStack_30 = result;
  result_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  iVar1 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar1 == 0) {
    end_local = flatcc_json_parser_object_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                           (int *)((long)&pval + 4));
    while (pval._4_4_ != 0) {
      end_local = flatcc_json_parser_symbol_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      uStack_60 = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
      if (uStack_60 < 0x6964000000000000) {
        if ((uStack_60 & 0xffffffffff000000) == 0x636f756e74000000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,5)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            val_1._6_2_ = 0;
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_uint16
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (uint16_t *)((long)&val_1 + 6));
            if (((char *)w == end_local) &&
               ((w = (uint64_t)end_local,
                end_local = flatcc_json_parser_symbolic_uint16
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)result_local,
                                       MyGame_Example_Stat_parse_json_table::symbolic_parsers,
                                       (uint16_t *)((long)&val_1 + 6)), end_local == (char *)w ||
                ((flatcc_builder_ref_t *)end_local == result_local)))) goto LAB_0011085f;
            if ((val_1._6_2_ != 0) || ((*(uint *)(buf_local + 0x10) & 2) != 0)) {
              pvStack_40 = flatcc_builder_table_add(*(flatcc_builder_t **)buf_local,2,2,2);
              if (pvStack_40 == (void *)0x0) goto LAB_0011085f;
              flatbuffers_uint16_write_to_pe(pvStack_40,val_1._6_2_);
            }
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if ((uStack_60 & 0xffffff0000000000) == 0x76616c0000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,3);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
        else {
          local_70 = 0;
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_int64
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                 &local_70);
          if (((char *)w == end_local) &&
             ((w = (uint64_t)end_local,
              end_local = flatcc_json_parser_symbolic_int64
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,
                                     MyGame_Example_Stat_parse_json_table::symbolic_parsers_1,
                                     &local_70), end_local == (char *)w ||
              ((flatcc_builder_ref_t *)end_local == result_local)))) goto LAB_0011085f;
          if ((local_70 != 0) || ((*(uint *)(buf_local + 0x10) & 2) != 0)) {
            pvStack_40 = flatcc_builder_table_add(*(flatcc_builder_t **)buf_local,1,8,8);
            if (pvStack_40 == (void *)0x0) goto LAB_0011085f;
            flatbuffers_int64_write_to_pe(pvStack_40,local_70);
          }
        }
      }
      else if ((uStack_60 & 0xffff000000000000) == 0x6964000000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,2);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
        else {
          end_local = flatcc_json_parser_build_string
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                 (flatcc_builder_ref_t *)((long)&pref + 4));
          if ((pref._4_4_ == 0) ||
             (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,0),
             (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_0011085f;
          *(flatcc_builder_ref_t *)mark = pref._4_4_;
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      }
      end_local = flatcc_json_parser_object_end
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             (int *)((long)&pval + 4));
    }
    if (*(int *)(buf_local + 0x20) == 0) {
      fVar2 = flatcc_builder_end_table(*(flatcc_builder_t **)buf_local);
      *pfStack_30 = fVar2;
      if (fVar2 != 0) {
        return end_local;
      }
    }
  }
LAB_0011085f:
  pcVar3 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,0x23);
  return pcVar3;
}

Assistant:

static const char *MyGame_Example_Stat_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6964000000000000) { /* branch "id" */
            if ((w & 0xffffffffff000000) == 0x636f756e74000000) { /* "count" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != UINT16_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 2, 2, 2))) goto failed;
                        flatbuffers_uint16_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "count" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "count" */
        } else { /* branch "id" */
            if ((w & 0xffffff0000000000) == 0x76616c0000000000) { /* "val" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    int64_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_int64(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int64(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != INT64_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 1, 8, 8))) goto failed;
                        flatbuffers_int64_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "val" */
                if ((w & 0xffff000000000000) == 0x6964000000000000) { /* "id" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "id" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "id" */
            } /* "val" */
        } /* branch "id" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}